

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetrahedron_monte_carlo.cpp
# Opt level: O0

double * monomial_value(int m,int n,int *e,double *x)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  double *pdVar4;
  double dVar5;
  double *v;
  int j;
  int i;
  double *x_local;
  int *e_local;
  int n_local;
  int m_local;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)n;
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar3);
  for (v._0_4_ = 0; (int)v < n; v._0_4_ = (int)v + 1) {
    pdVar4[(int)v] = 1.0;
  }
  for (v._4_4_ = 0; v._4_4_ < m; v._4_4_ = v._4_4_ + 1) {
    if (e[v._4_4_] != 0) {
      for (v._0_4_ = 0; (int)v < n; v._0_4_ = (int)v + 1) {
        dVar1 = pdVar4[(int)v];
        dVar5 = pow(x[v._4_4_ + (int)v * m],(double)e[v._4_4_]);
        pdVar4[(int)v] = dVar1 * dVar5;
      }
    }
  }
  return pdVar4;
}

Assistant:

double *monomial_value ( int m, int n, int e[], double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    MONOMIAL_VALUE evaluates a monomial.
//
//  Discussion:
//
//    This routine evaluates a monomial of the form
//
//      product ( 1 <= i <= m ) x(i)^e(i)
//
//    where the exponents are nonnegative integers.  Note that
//    if the combination 0^0 is encountered, it should be treated
//    as 1.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 May 2007
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the spatial dimension.
//
//    Input, int POINT_NUM, the number of points at which the
//    monomial is to be evaluated.
//
//    Input, int E[M], the exponents.
//
//    Input, double X[M*N], the point coordinates.
//
//    Output, double MONOMIAL_VALUE[N], the value of the monomial.
//
{
  int i;
  int j;
  double *v;

  v = new double[n];

  for ( j = 0; j < n; j++ )
  {
    v[j] = 1.0;
  }

  for ( i = 0; i < m; i++ )
  {
    if ( 0 != e[i] )
    {
      for ( j = 0; j < n; j++ )
      {
        v[j] = v[j] * pow ( x[i+j*m], e[i] );
      }
    }
  }

  return v;
}